

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O1

string * grpc_java_generator::anon_unknown_0::MixedLower
                   (string *__return_storage_ptr__,string *word)

{
  int __c;
  bool bVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tolower((int)*(word->_M_dataplus)._M_p);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  if (1 < word->_M_string_length) {
    uVar2 = 1;
    bVar1 = false;
    do {
      __c = (int)(word->_M_dataplus)._M_p[uVar2];
      if (__c != 0x5f) {
        if (bVar1) {
          toupper(__c);
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar2 = uVar2 + 1;
      bVar1 = __c == 0x5f;
    } while (uVar2 < word->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

static string MixedLower(const string &word) {
  string w;
  w += static_cast<string::value_type>(tolower(word[0]));
  bool after_underscore = false;
  for (size_t i = 1; i < word.length(); ++i) {
    if (word[i] == '_') {
      after_underscore = true;
    } else {
      w += after_underscore ? static_cast<string::value_type>(toupper(word[i]))
                            : word[i];
      after_underscore = false;
    }
  }
  return w;
}